

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool google::protobuf::TextFormat::PrintUnknownFieldsToString
               (UnknownFieldSet *unknown_fields,string *output)

{
  bool bVar1;
  Printer local_a0;
  string *local_18;
  string *output_local;
  UnknownFieldSet *unknown_fields_local;
  
  local_18 = output;
  output_local = (string *)unknown_fields;
  Printer::Printer(&local_a0);
  bVar1 = Printer::PrintUnknownFieldsToString(&local_a0,(UnknownFieldSet *)output_local,local_18);
  Printer::~Printer(&local_a0);
  return bVar1;
}

Assistant:

bool TextFormat::PrintUnknownFieldsToString(
    const UnknownFieldSet& unknown_fields, std::string* output) {
  return Printer().PrintUnknownFieldsToString(unknown_fields, output);
}